

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O1

void __thiscall
draco::VertexCornersIterator<draco::MeshAttributeCornerTable>::Next
          (VertexCornersIterator<draco::MeshAttributeCornerTable> *this)

{
  MeshAttributeCornerTable *pMVar1;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  pMVar1 = this->corner_table_;
  uVar4 = (this->corner_).value_;
  uVar3 = (ulong)uVar4;
  if (this->left_traversal_ == true) {
    if (uVar4 != 0xffffffff) {
      uVar3 = (ulong)(uVar4 - 2);
      if (0x55555555 < (uVar4 + 1) * -0x55555555) {
        uVar3 = (ulong)(uVar4 + 1);
      }
    }
    IVar2.value_ = 0xffffffff;
    if (((int)uVar3 != -1) &&
       ((*(ulong *)(*(long *)&(pMVar1->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                   (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0)) {
      IVar2.value_ = (pMVar1->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
    }
    uVar4 = IVar2.value_;
    if (IVar2.value_ != 0xffffffff) {
      uVar4 = IVar2.value_ - 2;
      if (0x55555555 < (IVar2.value_ + 1) * -0x55555555) {
        uVar4 = IVar2.value_ + 1;
      }
    }
    (this->corner_).value_ = uVar4;
    uVar5 = (this->start_corner_).value_;
    if (uVar4 == 0xffffffff) {
      if (uVar5 != 0xffffffff) {
        uVar5 = ((uVar5 * -0x55555555 < 0x55555556) - 1 | 2) + uVar5;
      }
      IVar2.value_ = 0xffffffff;
      if ((uVar5 != 0xffffffff) &&
         ((*(ulong *)(*(long *)&(pMVar1->is_edge_on_seam_).
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                     (ulong)(uVar5 >> 6) * 8) >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
        IVar2.value_ = (pMVar1->corner_table_->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
      }
      if (IVar2.value_ != 0xffffffff) {
        IVar2.value_ = IVar2.value_ + ((IVar2.value_ * -0x55555555 < 0x55555556) - 1 | 2);
      }
      (this->corner_).value_ = IVar2.value_;
      this->left_traversal_ = false;
      return;
    }
    if (uVar4 == uVar5) {
      (this->corner_).value_ = 0xffffffff;
      return;
    }
  }
  else {
    if (uVar4 != 0xffffffff) {
      uVar3 = (ulong)(((uVar4 * -0x55555555 < 0x55555556) - 1 | 2) + uVar4);
    }
    IVar2.value_ = 0xffffffff;
    if (((int)uVar3 != -1) &&
       ((*(ulong *)(*(long *)&(pMVar1->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                   (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0)) {
      IVar2.value_ = (pMVar1->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
    }
    if (IVar2.value_ != 0xffffffff) {
      IVar2.value_ = IVar2.value_ + ((IVar2.value_ * -0x55555555 < 0x55555556) - 1 | 2);
    }
    (this->corner_).value_ = IVar2.value_;
  }
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = corner_table_->SwingRight(start_corner_);
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }